

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall
caffe::ImageDataParameter::InternalSwap(ImageDataParameter *this,ImageDataParameter *other)

{
  InternalMetadataWithArena *this_00;
  float fVar1;
  bool bVar2;
  uint32 uVar3;
  int iVar4;
  string *psVar5;
  void *pvVar6;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar7;
  UnknownFieldSet *pUVar8;
  UnknownFieldSet *pUVar9;
  
  psVar5 = (this->source_).ptr_;
  (this->source_).ptr_ = (other->source_).ptr_;
  (other->source_).ptr_ = psVar5;
  psVar5 = (this->mean_file_).ptr_;
  (this->mean_file_).ptr_ = (other->mean_file_).ptr_;
  (other->mean_file_).ptr_ = psVar5;
  psVar5 = (this->root_folder_).ptr_;
  (this->root_folder_).ptr_ = (other->root_folder_).ptr_;
  (other->root_folder_).ptr_ = psVar5;
  uVar3 = this->crop_size_;
  this->crop_size_ = other->crop_size_;
  other->crop_size_ = uVar3;
  uVar3 = this->rand_skip_;
  this->rand_skip_ = other->rand_skip_;
  other->rand_skip_ = uVar3;
  bVar2 = this->shuffle_;
  this->shuffle_ = other->shuffle_;
  other->shuffle_ = bVar2;
  bVar2 = this->mirror_;
  this->mirror_ = other->mirror_;
  other->mirror_ = bVar2;
  uVar3 = this->new_height_;
  this->new_height_ = other->new_height_;
  other->new_height_ = uVar3;
  uVar3 = this->new_width_;
  this->new_width_ = other->new_width_;
  other->new_width_ = uVar3;
  bVar2 = this->is_color_;
  this->is_color_ = other->is_color_;
  other->is_color_ = bVar2;
  fVar1 = this->scale_;
  this->scale_ = other->scale_;
  other->scale_ = fVar1;
  uVar3 = this->batch_size_;
  this->batch_size_ = other->batch_size_;
  other->batch_size_ = uVar3;
  uVar3 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar3;
  this_00 = &other->_internal_metadata_;
  if ((((ulong)(this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_ & 1) != 0) ||
     (((ulong)(this_00->
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              ).ptr_ & 1) != 0)) {
    pvVar6 = (this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_;
    if (((ulong)pvVar6 & 1) == 0) {
      pUVar9 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&this_00->
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
    }
    else {
      pUVar9 = (UnknownFieldSet *)((ulong)pvVar6 & 0xfffffffffffffffe);
    }
    pvVar6 = (this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_;
    if (((ulong)pvVar6 & 1) == 0) {
      pUVar8 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
    }
    else {
      pUVar8 = (UnknownFieldSet *)((ulong)pvVar6 & 0xfffffffffffffffe);
    }
    pvVar7 = pUVar8->fields_;
    pUVar8->fields_ = pUVar9->fields_;
    pUVar9->fields_ = pvVar7;
  }
  iVar4 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar4;
  return;
}

Assistant:

void ImageDataParameter::InternalSwap(ImageDataParameter* other) {
  source_.Swap(&other->source_);
  mean_file_.Swap(&other->mean_file_);
  root_folder_.Swap(&other->root_folder_);
  std::swap(crop_size_, other->crop_size_);
  std::swap(rand_skip_, other->rand_skip_);
  std::swap(shuffle_, other->shuffle_);
  std::swap(mirror_, other->mirror_);
  std::swap(new_height_, other->new_height_);
  std::swap(new_width_, other->new_width_);
  std::swap(is_color_, other->is_color_);
  std::swap(scale_, other->scale_);
  std::swap(batch_size_, other->batch_size_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}